

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_format_mtree_quoted_filename.c
# Opt level: O3

void test_write_format_mtree_quoted_filename(void)

{
  wchar_t wVar1;
  int iVar2;
  mode_t mVar3;
  archive *paVar4;
  archive_entry *entry;
  char *v2;
  size_t used;
  archive_entry *ae;
  size_t local_40;
  archive_entry *local_38;
  
  paVar4 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                   ,L',',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                   (void *)0x0);
  wVar1 = archive_write_set_format_mtree(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'-',0,"ARCHIVE_OK",(long)wVar1,"archive_write_set_format_mtree(a)",paVar4);
  iVar2 = archive_write_set_format_option(paVar4,(char *)0x0,"all",(char *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_format_option(a, NULL, \"all\", NULL)",paVar4);
  iVar2 = archive_write_set_format_option(paVar4,(char *)0x0,"type","1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'1',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_format_option(a, NULL, \"type\", \"1\")",paVar4);
  iVar2 = archive_write_set_format_option(paVar4,(char *)0x0,"mode","1");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'3',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_set_format_option(a, NULL, \"mode\", \"1\")",paVar4);
  iVar2 = archive_write_open_memory(paVar4,buff,0xfff,&local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'5',0,"ARCHIVE_OK",(long)iVar2,
                      "archive_write_open_memory(a, buff, sizeof(buff)-1, &used)",paVar4);
  entry = archive_entry_new();
  local_38 = entry;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                   ,L'8',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL",
                   (void *)0x0);
  archive_entry_set_mode(entry,0x81a4);
  mVar3 = archive_entry_mode(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L':',0x81a4,"AE_IFREG | 0644",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  archive_entry_copy_pathname(entry,"./a !$#&=_^z\x7f~");
  iVar2 = archive_write_header(paVar4,entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4);
  archive_entry_free(entry);
  iVar2 = archive_write_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'?',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
  iVar2 = archive_write_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'@',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
  buff[local_40] = '\0';
  failure("#, = and \\ in the filename should be quoted");
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
             ,L'D',buff,"buff","#mtree\n./a\\040!$\\043&\\075_^z\\177~ mode=644 type=file\n","image"
             ,(void *)0x0,L'\0');
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                   ,L'I',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar2 = archive_read_support_format_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'J',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",paVar4);
  iVar2 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'K',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",paVar4);
  iVar2 = archive_read_open_memory(paVar4,buff,local_40);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'L',0,"ARCHIVE_OK",(long)iVar2,"archive_read_open_memory(a, buff, used)",
                      paVar4);
  iVar2 = archive_read_next_header(paVar4,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'O',0,"ARCHIVE_OK",(long)iVar2,"archive_read_next_header(a, &ae)",paVar4);
  mVar3 = archive_entry_mode(local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'P',0x81a4,"AE_IFREG | 0644",(ulong)mVar3,"archive_entry_mode(ae)",
                      (void *)0x0);
  v2 = archive_entry_pathname(local_38);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
             ,L'Q',"./a !$#&=_^z\x7f~","\"./a !$#&=_^z\\177~\"",v2,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  iVar2 = archive_read_close(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'R',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
  iVar2 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_write_format_mtree_quoted_filename.c"
                      ,L'S',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_write_format_mtree_quoted_filename)
{
	struct archive_entry *ae;
	struct archive* a;
	size_t used;

	/* Create a mtree format archive. */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_mtree(a));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_set_format_option(a, NULL, "all", NULL));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_set_format_option(a, NULL, "type", "1"));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_set_format_option(a, NULL, "mode", "1"));
	assertEqualIntA(a, ARCHIVE_OK,
		archive_write_open_memory(a, buff, sizeof(buff)-1, &used));

	/* Write entry which has #, = , \ and DEL(0177) in the filename. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_mode(ae, AE_IFREG | 0644);
	assertEqualInt(AE_IFREG | 0644, archive_entry_mode(ae));
	archive_entry_copy_pathname(ae, "./a !$#&=_^z\177~");
	assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
	archive_entry_free(ae);

	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
        assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	buff[used] = '\0';
	failure("#, = and \\ in the filename should be quoted");
	assertEqualString(buff, image);

	/*
	 * Read the data and check it.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open_memory(a, buff, used));

	/* Read entry */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualInt(AE_IFREG | 0644, archive_entry_mode(ae));
	assertEqualString("./a !$#&=_^z\177~", archive_entry_pathname(ae));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}